

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void BoardTest<uttt::IBoard>(void)

{
  int iVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  vector<long,_std::allocator<long>_> moves_1;
  vector<long,_std::allocator<long>_> moves;
  IBoard game;
  uniform_int_distribution<int> local_78;
  _Vector_base<long,_std::allocator<long>_> local_70;
  _Vector_base<long,_std::allocator<long>_> local_58;
  IBoard local_38;
  
  if (BoardTest<uttt::IBoard>()::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&BoardTest<uttt::IBoard>()::rd);
    if (iVar1 != 0) {
      std::random_device::random_device(&BoardTest<uttt::IBoard>::rd);
      __cxa_atexit(std::random_device::~random_device,&BoardTest<uttt::IBoard>::rd,&__dso_handle);
      __cxa_guard_release(&BoardTest<uttt::IBoard>()::rd);
    }
  }
  if (BoardTest<uttt::IBoard>()::gen == '\0') {
    iVar1 = __cxa_guard_acquire(&BoardTest<uttt::IBoard>()::gen);
    if (iVar1 != 0) {
      uVar3 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&BoardTest<uttt::IBoard>::gen,(ulong)uVar3);
      __cxa_guard_release(&BoardTest<uttt::IBoard>()::gen);
    }
  }
  uttt::IBoard::IBoard(&local_38);
  uttt::IBoard::Print(&local_38);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    iVar1 = uttt::IBoard::GetStatus(&local_38);
    if (iVar1 != -1) break;
    uttt::IBoard::GetPossibleMoves((vector<long,_std::allocator<long>_> *)&local_70,&local_38);
    local_78._M_param._M_b =
         (int)((ulong)((long)local_70._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_70._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_78._M_param._M_a = 0;
    rVar2 = std::uniform_int_distribution<int>::operator()(&local_78,&BoardTest<uttt::IBoard>::gen);
    uttt::IBoard::ApplyMove(&local_38,local_70._M_impl.super__Vector_impl_data._M_start + rVar2);
    uttt::IBoard::Print(&local_38);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_70);
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void
BoardTest()
{
    static std::random_device rd;
    static std::mt19937 gen(rd());
    IGame game;
    game.Print();
    std::vector<game::IMove> moves;
    while (game.GetStatus() == game::Undecided)
    {
        auto moves = game.GetPossibleMoves();
        game.ApplyMove(moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)]);
        game.Print();
    }
}